

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

int ma_device__jack_buffer_size_callback(ma_jack_nframes_t frameCount,void *pUserData)

{
  long lVar1;
  code *pcVar2;
  uint uVar3;
  void *pvVar4;
  ulong uVar5;
  
  if (pUserData == (void *)0x0) {
    __assert_fail("pDevice != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x5134,"int ma_device__jack_buffer_size_callback(ma_jack_nframes_t, void *)");
  }
  uVar3 = *(uint *)((long)pUserData + 8);
  if ((uVar3 & 0xfffffffe) == 2) {
    uVar5 = (ulong)(*(int *)((long)pUserData + 0x2bcc) * frameCount *
                   (&DAT_001158a0)[*(uint *)((long)pUserData + 0x2bc8)]);
    lVar1 = *pUserData;
    if (*(code **)(lVar1 + 0x28) == (code *)0x0) {
      if (*(code **)(lVar1 + 0x30) == (code *)0x0) {
        return -4;
      }
      pvVar4 = (void *)(**(code **)(lVar1 + 0x30))(0,uVar5,*(undefined8 *)(lVar1 + 0x20));
    }
    else {
      pvVar4 = (void *)(**(code **)(lVar1 + 0x28))(uVar5);
    }
    if (pvVar4 == (void *)0x0) {
      return -4;
    }
    memset(pvVar4,0,uVar5);
    if (*(long *)((long)pUserData + 0x5580) != 0) {
      pcVar2 = *(code **)(*pUserData + 0x38);
      if (pcVar2 != (code *)0x0) {
        (*pcVar2)(*(long *)((long)pUserData + 0x5580),*(undefined8 *)(*pUserData + 0x20));
      }
    }
    *(void **)((long)pUserData + 0x5580) = pvVar4;
    *(ma_jack_nframes_t *)((long)pUserData + 0x31c) = frameCount;
    uVar3 = *(uint *)((long)pUserData + 8);
  }
  if ((uVar3 | 2) != 3) {
    return 0;
  }
  uVar5 = (ulong)(*(int *)((long)pUserData + 0x2f4) * frameCount *
                 (&DAT_001158a0)[*(uint *)((long)pUserData + 0x2f0)]);
  lVar1 = *pUserData;
  if (*(code **)(lVar1 + 0x28) == (code *)0x0) {
    if (*(code **)(lVar1 + 0x30) == (code *)0x0) {
      return -4;
    }
    pvVar4 = (void *)(**(code **)(lVar1 + 0x30))(0,uVar5,*(undefined8 *)(lVar1 + 0x20));
  }
  else {
    pvVar4 = (void *)(**(code **)(lVar1 + 0x28))(uVar5);
  }
  if (pvVar4 == (void *)0x0) {
    return -4;
  }
  memset(pvVar4,0,uVar5);
  if (*(long *)((long)pUserData + 0x5578) != 0) {
    pcVar2 = *(code **)(*pUserData + 0x38);
    if (pcVar2 != (code *)0x0) {
      (*pcVar2)(*(long *)((long)pUserData + 0x5578),*(undefined8 *)(*pUserData + 0x20));
    }
  }
  *(void **)((long)pUserData + 0x5578) = pvVar4;
  *(ma_jack_nframes_t *)((long)pUserData + 0x31c) = frameCount;
  return 0;
}

Assistant:

static int ma_device__jack_buffer_size_callback(ma_jack_nframes_t frameCount, void* pUserData)
{
    ma_device* pDevice = (ma_device*)pUserData;
    MA_ASSERT(pDevice != NULL);

    if (pDevice->type == ma_device_type_capture || pDevice->type == ma_device_type_duplex) {
        size_t newBufferSize = frameCount * (pDevice->capture.internalChannels * ma_get_bytes_per_sample(pDevice->capture.internalFormat));
        float* pNewBuffer = (float*)ma__calloc_from_callbacks(newBufferSize, &pDevice->pContext->allocationCallbacks);
        if (pNewBuffer == NULL) {
            return MA_OUT_OF_MEMORY;
        }

        ma__free_from_callbacks(pDevice->jack.pIntermediaryBufferCapture, &pDevice->pContext->allocationCallbacks);

        pDevice->jack.pIntermediaryBufferCapture = pNewBuffer;
        pDevice->playback.internalPeriodSizeInFrames = frameCount;
    }

    if (pDevice->type == ma_device_type_playback || pDevice->type == ma_device_type_duplex) {
        size_t newBufferSize = frameCount * (pDevice->playback.internalChannels * ma_get_bytes_per_sample(pDevice->playback.internalFormat));
        float* pNewBuffer = (float*)ma__calloc_from_callbacks(newBufferSize, &pDevice->pContext->allocationCallbacks);
        if (pNewBuffer == NULL) {
            return MA_OUT_OF_MEMORY;
        }

        ma__free_from_callbacks(pDevice->jack.pIntermediaryBufferPlayback, &pDevice->pContext->allocationCallbacks);

        pDevice->jack.pIntermediaryBufferPlayback = pNewBuffer;
        pDevice->playback.internalPeriodSizeInFrames = frameCount;
    }

    return 0;
}